

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void __thiscall Fl_Window_Type::write_code2(Fl_Window_Type *this)

{
  Fl_Widget *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  iVar2 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x26])();
  pcVar4 = (this->super_Fl_Widget_Type).super_Fl_Type.name_;
  pcVar5 = "o";
  if (pcVar4 != (char *)0x0) {
    pcVar5 = pcVar4;
  }
  pcVar4 = "this";
  if (iVar2 == 0) {
    pcVar4 = pcVar5;
  }
  Fl_Widget_Type::write_extra_code(&this->super_Fl_Widget_Type);
  if (this->modal == '\0') {
    if (this->non_modal == '\0') goto LAB_0018e287;
    pcVar5 = "%s%s->set_non_modal();\n";
  }
  else {
    pcVar5 = "%s%s->set_modal();\n";
  }
  pcVar3 = indent();
  write_c(pcVar5,pcVar3,pcVar4);
LAB_0018e287:
  if ((((this->super_Fl_Widget_Type).o)->flags_ & 8) != 0) {
    pcVar5 = indent();
    write_c("%s%s->clear_border();\n",pcVar5,pcVar4);
  }
  if ((this->super_Fl_Widget_Type).xclass != (char *)0x0) {
    pcVar5 = indent();
    write_c("%s%s->xclass(",pcVar5,pcVar4);
    write_cstring((this->super_Fl_Widget_Type).xclass);
    write_c(");\n");
  }
  if (this->sr_max_h == 0 && this->sr_max_w == 0) {
    if (this->sr_min_h != 0 || this->sr_min_w != 0) {
      pcVar5 = indent();
      write_c("%s%s->size_range(%d, %d);\n",pcVar5,pcVar4,(ulong)(uint)this->sr_min_w,
              (ulong)(uint)this->sr_min_h);
    }
  }
  else {
    pcVar5 = indent();
    write_c("%s%s->size_range(%d, %d, %d, %d);\n",pcVar5,pcVar4,(ulong)(uint)this->sr_min_w,
            (ulong)(uint)this->sr_min_h,(ulong)(uint)this->sr_max_w,this->sr_max_h);
  }
  pcVar5 = indent();
  write_c("%s%s->end();\n",pcVar5,pcVar4);
  pFVar1 = (this->super_Fl_Widget_Type).o;
  if ((Fl_Widget *)pFVar1[1].callback_ == pFVar1) {
    pcVar5 = indent();
    write_c("%s%s->resizable(%s);\n",pcVar5,pcVar4,pcVar4);
  }
  Fl_Widget_Type::write_block_close(&this->super_Fl_Widget_Type);
  return;
}

Assistant:

void Fl_Window_Type::write_code2() {
  const char *var = is_class() ? "this" : name() ? name() : "o";
  write_extra_code();
  if (modal) write_c("%s%s->set_modal();\n", indent(), var);
  else if (non_modal) write_c("%s%s->set_non_modal();\n", indent(), var);
  if (!((Fl_Window*)o)->border()) {
    write_c("%s%s->clear_border();\n", indent(), var);
  }
  if (xclass) {
    write_c("%s%s->xclass(", indent(), var);
    write_cstring(xclass);
    write_c(");\n");
  }
  if (sr_max_w || sr_max_h) {
    write_c("%s%s->size_range(%d, %d, %d, %d);\n", indent(), var,
            sr_min_w, sr_min_h, sr_max_w, sr_max_h);
  } else if (sr_min_w || sr_min_h) {
    write_c("%s%s->size_range(%d, %d);\n", indent(), var, sr_min_w, sr_min_h);
  }
  write_c("%s%s->end();\n", indent(), var);
  if (((Fl_Window*)o)->resizable() == o)
    write_c("%s%s->resizable(%s);\n", indent(), var, var);
  write_block_close();
}